

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O0

void Ntk_NetworkSymmsPrint(Abc_Ntk_t *pNtk,Extra_SymmInfo_t *pSymms)

{
  bool bVar1;
  int iVar2;
  char **__ptr;
  void *__s;
  int fStart;
  int nSize;
  int nVars;
  int k;
  int i;
  int *pVarTaken;
  char **pInputNames;
  Extra_SymmInfo_t *pSymms_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkCiNum(pNtk);
  __ptr = Abc_NtkCollectCioNames(pNtk,0);
  __s = malloc((long)iVar2 << 2);
  memset(__s,0,(long)iVar2 << 2);
  bVar1 = true;
  iVar2 = pSymms->nVars;
  nVars = 0;
  do {
    if (iVar2 <= nVars) {
      printf("\n");
      if (__ptr != (char **)0x0) {
        free(__ptr);
      }
      if (__s != (void *)0x0) {
        free(__s);
      }
      return;
    }
    if (*(int *)((long)__s + (long)nVars * 4) == 0) {
      for (nSize = 0; nSize < iVar2; nSize = nSize + 1) {
        if ((nSize != nVars) && (pSymms->pSymms[nVars][nSize] != '\0')) {
          if (*(int *)((long)__s + (long)nSize * 4) != 0) {
            __assert_fail("pVarTaken[k] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSymm.c"
                          ,0xd3,"void Ntk_NetworkSymmsPrint(Abc_Ntk_t *, Extra_SymmInfo_t *)");
          }
          if (bVar1) {
            bVar1 = false;
            printf("  { %s",__ptr[pSymms->pVars[nVars]]);
            *(undefined4 *)((long)__s + (long)nVars * 4) = 1;
          }
          printf(" %s",__ptr[pSymms->pVars[nSize]]);
          *(undefined4 *)((long)__s + (long)nSize * 4) = 1;
        }
      }
      if (!bVar1) {
        printf(" }");
        bVar1 = true;
      }
    }
    nVars = nVars + 1;
  } while( true );
}

Assistant:

void Ntk_NetworkSymmsPrint( Abc_Ntk_t * pNtk, Extra_SymmInfo_t * pSymms )
{
    char ** pInputNames;
    int * pVarTaken;
    int i, k, nVars, nSize, fStart;

    // get variable names
    nVars = Abc_NtkCiNum(pNtk);
    pInputNames = Abc_NtkCollectCioNames( pNtk, 0 );

    // alloc the array of marks
    pVarTaken = ABC_ALLOC( int, nVars );
    memset( pVarTaken, 0, sizeof(int) * nVars );

    // print the groups
    fStart = 1;
    nSize = pSymms->nVars;
    for ( i = 0; i < nSize; i++ )
    {
        // skip the variable already considered
        if ( pVarTaken[i] )
            continue;
        // find all the vars symmetric with this one
        for ( k = 0; k < nSize; k++ )
        {
            if ( k == i )
                continue;
            if ( pSymms->pSymms[i][k] == 0 )
                continue;
            // vars i and k are symmetric
            assert( pVarTaken[k] == 0 );
            // there is a new symmetry pair 
            if ( fStart == 1 )
            {  // start a new symmetry class
                fStart = 0;
                printf( "  { %s", pInputNames[ pSymms->pVars[i] ] );
                // mark the var as taken
                pVarTaken[i] = 1;
            }
            printf( " %s", pInputNames[ pSymms->pVars[k] ] );
            // mark the var as taken
            pVarTaken[k] = 1;
        }
        if ( fStart == 0 )
        {
            printf( " }" );
            fStart = 1; 
        }   
    }   
    printf( "\n" );

    ABC_FREE( pInputNames );
    ABC_FREE( pVarTaken );
}